

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * __thiscall
ON_ManagedFonts::GetFromFontCharacteristics
          (ON_ManagedFonts *this,ON_Font *font_characteristics,bool bCreateIfNotFound)

{
  ON_FontList *this_00;
  double dVar1;
  bool bVar2;
  element_type *peVar3;
  unique_ptr<ON_Font,_std::default_delete<ON_Font>_> uVar4;
  undefined4 uVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  wchar_t *pwVar10;
  wchar_t *pwVar11;
  _Head_base<0UL,_ON_Font_*,_false> _Var12;
  undefined7 in_register_00000011;
  NameLocale name_locale;
  ON_MemoryAllocationTracking OVar13;
  ON_Font *available_font;
  ON_FontMetrics *managed_font_metrics_in_font_design_units;
  undefined1 local_130 [32];
  ON_wString OStack_110;
  unique_ptr<ON_Font,_std::default_delete<ON_Font>_> fup;
  undefined1 local_100 [16];
  ON_MemoryAllocationTracking disable_tracking;
  
  if ((this->m_managed_fonts).m_by_index.m_count == 0) {
    Internal_AddManagedFont(this,&ON_Font::Default,(ON_FontMetrics *)0x0);
  }
  if (font_characteristics->m_runtime_serial_number != 0) {
    return font_characteristics;
  }
  local_100._12_4_ = (undefined4)CONCAT71(in_register_00000011,bCreateIfNotFound);
  bVar7 = font_characteristics->m_font_bUnderlined;
  bVar2 = font_characteristics->m_font_bStrikethrough;
  dVar1 = font_characteristics->m_point_size;
  local_130._24_8_ = -(ulong)(dVar1 < 10000000000.0) & (ulong)dVar1 & -(ulong)(0.0 < dVar1);
  OStack_110.m_s = (wchar_t *)0x0;
  fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
  super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
  super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl =
       (__uniq_ptr_data<ON_Font,_std::default_delete<ON_Font>,_true,_true>)
       (__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>)0x0;
  bVar6 = ON_Font::IsInstalledFont(font_characteristics);
  local_130._20_4_ = ZEXT14(bVar7);
  local_130._16_4_ = ZEXT14(bVar2);
  local_130[0xf] = bVar7;
  if (!bVar6) {
    ON_Font::PostScriptName((ON_Font *)&disable_tracking);
    bVar7 = ON_wString::IsNotEmpty((ON_wString *)&disable_tracking);
    bVar6 = true;
    if (!bVar7) {
      ON_Font::WindowsLogfontName((ON_Font *)local_130);
      bVar7 = ON_wString::IsNotEmpty((ON_wString *)local_130);
      bVar6 = true;
      if (!bVar7) {
        ON_Font::FamilyName((ON_Font *)local_100);
        bVar6 = ON_wString::IsNotEmpty((ON_wString *)local_100);
        ON_wString::~ON_wString((ON_wString *)local_100);
      }
      ON_wString::~ON_wString((ON_wString *)local_130);
    }
    ON_wString::~ON_wString((ON_wString *)&disable_tracking);
    if (bVar6 == false) {
LAB_00495188:
      std::make_unique<ON_Font,ON_Font_const&>((ON_Font *)&disable_tracking);
      OVar13 = disable_tracking;
      disable_tracking.m_this_statck_depth = 0;
      disable_tracking.m_this_crt_dbg_flag0 = 0;
      std::__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>::reset
                ((__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_> *)&fup,(pointer)OVar13);
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr
                ((unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&disable_tracking);
      uVar4 = fup;
      if ((__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>)
          fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
          super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
          super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>)0x0) {
        if (bVar6 == false) {
          ON_Font::operator=((ON_Font *)
                             fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>.
                             _M_t.super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                             super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,&ON_Font::Default)
          ;
        }
        else {
          ON_Font::SetUnsetProperties
                    ((ON_Font *)
                     fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                     super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                     super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,&ON_Font::Default,false);
        }
        ON_Font::SetUnderlined
                  ((ON_Font *)
                   uVar4._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                   super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,SUB41(local_130._20_4_,0));
        OVar13.m_this_crt_dbg_flag0 = 0;
        OVar13.m_this_statck_depth = local_130._16_4_;
        ON_Font::SetStrikethrough
                  ((ON_Font *)
                   uVar4._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                   super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,SUB41(local_130._16_4_,0));
        ON_Font::SetPointSize
                  ((ON_Font *)
                   uVar4._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                   super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,(double)local_130._24_8_);
        font_characteristics = (ON_Font *)uVar4;
      }
    }
    else {
      OVar13.m_this_statck_depth = 0;
      OVar13.m_this_crt_dbg_flag0 = 0;
      bVar7 = ON_Font::HasUnsetProperties(font_characteristics,false,false);
      if (bVar7) goto LAB_00495188;
    }
    bVar7 = ON_Font::IsValid(font_characteristics,(ON_TextLog *)OVar13);
    if (!bVar7) {
      available_font = &ON_Font::Default;
      goto LAB_004956bb;
    }
  }
  uVar5 = local_100._12_4_;
  local_130[0xf] = local_130[0xf] | bVar2;
  if (local_130[0xf] == 0) {
    if (((double)local_130._24_8_ != 0.0) || (NAN((double)local_130._24_8_))) {
      if (((double)local_130._24_8_ != ON_Font::Default.m_point_size) ||
         (NAN((double)local_130._24_8_) || NAN(ON_Font::Default.m_point_size))) goto LAB_00495494;
    }
    available_font = &ON_Font::Default;
    bVar7 = ON_Font::EqualWeightStretchStyle(&ON_Font::Default,font_characteristics,false);
    if (bVar7) {
      name_locale = (NameLocale)font_characteristics;
      ON_Font::PostScriptName((ON_Font *)&disable_tracking,name_locale);
      bVar7 = ON_wString::IsNotEmpty((ON_wString *)&disable_tracking);
      if (bVar7) {
        pwVar10 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&disable_tracking);
        ON_Font::PostScriptName((ON_Font *)local_130,0xf8);
        pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_130);
        bVar7 = ON_wString::EqualOrdinal(pwVar10,pwVar11,true);
      }
      else {
        ON_Font::WindowsLogfontName((ON_Font *)local_130,name_locale);
        ON_wString::operator=((ON_wString *)&disable_tracking,(ON_wString *)local_130);
        ON_wString::~ON_wString((ON_wString *)local_130);
        bVar7 = ON_wString::IsNotEmpty((ON_wString *)&disable_tracking);
        if (!bVar7) {
          ON_Font::FamilyName((ON_Font *)local_130,name_locale);
          ON_wString::operator=((ON_wString *)&disable_tracking,(ON_wString *)local_130);
          ON_wString::~ON_wString((ON_wString *)local_130);
          bVar7 = ON_wString::IsNotEmpty((ON_wString *)&disable_tracking);
          if (bVar7) {
            pwVar10 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&disable_tracking);
            available_font = &ON_Font::Default;
            ON_Font::FamilyName((ON_Font *)local_130,0xf8);
            pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_130);
            bVar7 = ON_wString::EqualOrdinal(pwVar10,pwVar11,true);
            ON_wString::~ON_wString((ON_wString *)local_130);
            if (bVar7) {
              ON_Font::FaceName((ON_Font *)local_130,name_locale);
              ON_wString::operator=((ON_wString *)&disable_tracking,(ON_wString *)local_130);
              ON_wString::~ON_wString((ON_wString *)local_130);
              bVar7 = ON_wString::IsEmpty((ON_wString *)&disable_tracking);
              if (!bVar7) {
                pwVar10 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&disable_tracking);
                ON_Font::FaceName((ON_Font *)local_130,0xf8);
                pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_130);
                bVar7 = ON_wString::EqualOrdinal(pwVar10,pwVar11,true);
                ON_wString::~ON_wString((ON_wString *)local_130);
                if (!bVar7) goto LAB_0049548a;
              }
              ON_wString::~ON_wString((ON_wString *)&disable_tracking);
              goto LAB_004956bb;
            }
          }
LAB_0049548a:
          ON_wString::~ON_wString((ON_wString *)&disable_tracking);
          goto LAB_00495494;
        }
        pwVar10 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&disable_tracking);
        ON_Font::WindowsLogfontName((ON_Font *)local_130,0xf8);
        pwVar11 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_130);
        bVar7 = ON_wString::EqualOrdinal(pwVar10,pwVar11,true);
      }
      ON_wString::~ON_wString((ON_wString *)local_130);
      ON_wString::~ON_wString((ON_wString *)&disable_tracking);
      if (bVar7 != false) goto LAB_004956bb;
    }
  }
LAB_00495494:
  this_00 = &this->m_managed_fonts;
  available_font =
       ON_FontList::FromFontProperties
                 (this_00,font_characteristics,true,true,SUB41(local_130._20_4_,0),
                  SUB41(local_130._16_4_,0),(double)local_130._24_8_);
  if (local_130[0xf] == 1 && available_font == (ON_Font *)0x0) {
    ON_Font::ON_Font((ON_Font *)&disable_tracking,font_characteristics);
    ON_Font::SetUnderlined((ON_Font *)&disable_tracking,false);
    ON_Font::SetStrikethrough((ON_Font *)&disable_tracking,false);
    available_font =
         ON_FontList::FromFontProperties
                   (this_00,(ON_Font *)&disable_tracking,true,true,false,false,
                    (double)local_130._24_8_);
    ON_Font::~ON_Font((ON_Font *)&disable_tracking);
  }
  uVar8 = ON_Font::WeightStretchStyleDeviation(font_characteristics,available_font);
  uVar9 = ON_Font::UnderlinedStrikethroughDeviation(font_characteristics,available_font);
  if ((available_font != (ON_Font *)0x0) && (uVar9 == 0 && uVar8 == 0)) {
    if (((double)local_130._24_8_ == available_font->m_point_size) &&
       (!NAN((double)local_130._24_8_) && !NAN(available_font->m_point_size))) goto LAB_004956bb;
  }
  bVar7 = ON_Font::IsInstalledFont(font_characteristics);
  if ((!bVar7) &&
     (_Var12._M_head_impl =
           ON_FontList::FromFontProperties(&this->m_installed_fonts,font_characteristics,true,true),
     _Var12._M_head_impl != (ON_Font *)0x0)) {
    font_characteristics = _Var12._M_head_impl;
    if ((0.0 < (double)local_130._24_8_ | local_130[0xf]) == 1) {
      std::make_unique<ON_Font,ON_Font_const&>((ON_Font *)&disable_tracking);
      OVar13 = disable_tracking;
      disable_tracking.m_this_statck_depth = 0;
      disable_tracking.m_this_crt_dbg_flag0 = 0;
      std::__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>::reset
                ((__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_> *)&fup,(pointer)OVar13);
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr
                ((unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&disable_tracking);
      uVar4 = fup;
      if ((__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>)
          fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
          super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
          super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>)0x0) {
        ON_Font::SetUnderlined
                  ((ON_Font *)
                   fup._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                   super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,SUB41(local_130._20_4_,0));
        ON_Font::SetStrikethrough
                  ((ON_Font *)
                   uVar4._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                   super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,SUB41(local_130._16_4_,0));
        ON_Font::SetPointSize
                  ((ON_Font *)
                   uVar4._M_t.super___uniq_ptr_impl<ON_Font,_std::default_delete<ON_Font>_>._M_t.
                   super__Tuple_impl<0UL,_ON_Font_*,_std::default_delete<ON_Font>_>.
                   super__Head_base<0UL,_ON_Font_*,_false>._M_head_impl,(double)local_130._24_8_);
        font_characteristics = (ON_Font *)uVar4;
      }
    }
    available_font =
         ON_FontList::FromFontProperties
                   (this_00,font_characteristics,true,true,SUB41(local_130._20_4_,0),
                    SUB41(local_130._16_4_,0),(double)local_130._24_8_);
    uVar8 = ON_Font::WeightStretchStyleDeviation
                      (*(Weight *)((long)font_characteristics + 0x18),
                       *(Stretch *)((long)font_characteristics + 0x1a),
                       *(Style *)((long)font_characteristics + 0x19),available_font);
    uVar9 = ON_Font::UnderlinedStrikethroughDeviation
                      (*(bool *)((long)font_characteristics + 0x1b),
                       *(bool *)((long)font_characteristics + 0x1c),available_font);
    if ((available_font != (ON_Font *)0x0) && (uVar9 == 0 && uVar8 == 0)) goto LAB_004956bb;
  }
  if ((char)uVar5 == '\0') {
    available_font = (ON_Font *)0x0;
  }
  else {
    ON_MemoryAllocationTracking::ON_MemoryAllocationTracking(&disable_tracking,false);
    peVar3 = (font_characteristics->m_font_glyph_cache).
             super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    managed_font_metrics_in_font_design_units = &peVar3->m_font_unit_metrics;
    if (peVar3 == (element_type *)0x0) {
      managed_font_metrics_in_font_design_units = (ON_FontMetrics *)0x0;
    }
    available_font = (ON_Font *)operator_new(0xc0);
    ON_Font::ON_Font(available_font,ManagedFont,font_characteristics);
    Internal_AddManagedFont(this,available_font,managed_font_metrics_in_font_design_units);
    ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking(&disable_tracking);
  }
LAB_004956bb:
  std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr(&fup);
  return available_font;
}

Assistant:

const ON_Font* ON_ManagedFonts::GetFromFontCharacteristics(
  const ON_Font& font_characteristics,
  bool bCreateIfNotFound
)
{
  if ( 0 == m_managed_fonts.Count() )
  {
    // Put ON_Font::Default as the first entry in this list.
    Internal_AddManagedFont( &ON_Font::Default, nullptr );
  }

  if (font_characteristics.IsManagedFont())
    return &font_characteristics;


  const bool bIsUnderlined = font_characteristics.IsUnderlined();
  const bool bIsStrikethrough = font_characteristics.IsStrikethrough();
  const double point_size
    = ON_Font::IsValidPointSize(font_characteristics.PointSize())
    ? font_characteristics.PointSize()
    : 0.0;

  const ON_Font* set_font_characteristics = &font_characteristics;

  std::unique_ptr< ON_Font > fup;
  if (false == font_characteristics.IsInstalledFont())
  {
    bool bHaveName
      = font_characteristics.PostScriptName().IsNotEmpty()
      || font_characteristics.WindowsLogfontName().IsNotEmpty()
      || font_characteristics.FamilyName().IsNotEmpty();
    if ( false == bHaveName || font_characteristics.HasUnsetProperties(false, false) )
    {
      fup = std::make_unique< ON_Font >(font_characteristics);
      ON_Font* temporary_font = fup.get();
      if (nullptr != temporary_font)
      {
        if (false == bHaveName)
        {
          *temporary_font = ON_Font::Default;
        }
        else
        {
          temporary_font->SetUnsetProperties(ON_Font::Default, true);
        }
        temporary_font->SetUnderlined(bIsUnderlined);
        temporary_font->SetStrikethrough(bIsStrikethrough);
        temporary_font->SetPointSize(point_size);
        set_font_characteristics = temporary_font;
      }
    }

    if (false == set_font_characteristics->IsValid())
      return &ON_Font::Default;
  }

  ON_Font::NameLocale name_locale = ON_Font::NameLocale::LocalizedFirst;

  for (;;)
  {
    // quick test for default font that occurs often enough to warrant the special checking
    if (bIsUnderlined)
      break;
    if (bIsStrikethrough)
      break;
    if (0.0 != point_size && point_size != ON_Font::Default.m_point_size)
      break;

    if (false == ON_Font::EqualWeightStretchStyle(&ON_Font::Default, set_font_characteristics, false))
      break; // there are multiple weight-stretch-style settings for the same family name and same LOGFONT.lfFaceName.

    ON_wString name = set_font_characteristics->PostScriptName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.PostScriptName(name_locale), true))
      {
        return &ON_Font::Default;
      }
      break; // Different PostScript names
    }

    name = set_font_characteristics->WindowsLogfontName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.WindowsLogfontName(name_locale), true))
      {
        return &ON_Font::Default;
      }
      break; // Different LOGFONT settings
    }

    name = set_font_characteristics->FamilyName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.FamilyName(name_locale), true))
      {
        name = set_font_characteristics->FaceName(name_locale);
        if (
          name.IsEmpty()
          || ON_wString::EqualOrdinal(name, ON_Font::Default.FaceName(name_locale), true)
          )
        {
          return &ON_Font::Default;
        }
      }
      break; // Different faces
    }

    break;
  }

  const ON_Font* managed_font = m_managed_fonts.FromFontProperties(
    set_font_characteristics,
    true,
    true,
    bIsUnderlined,
    bIsStrikethrough,
    point_size
    );

  if (nullptr == managed_font && (bIsUnderlined || bIsStrikethrough))
  {
    ON_Font undecorated(*set_font_characteristics);
    undecorated.SetUnderlined(false);
    undecorated.SetStrikethrough(false);
    managed_font = m_managed_fonts.FromFontProperties(
      &undecorated,
      true,
      true,
      false, // ignore bIsUnderlined
      false, // ignore bIsStrikethrough
      point_size
    );
  }

  unsigned int managed_font_wss_dev = ON_Font::WeightStretchStyleDeviation(
    set_font_characteristics, 
    managed_font
  );

  // Lowell - Added additional check for matching underline and strikethrough settings RH-60947
  unsigned int managed_font_us_dev = ON_Font::UnderlinedStrikethroughDeviation(
    set_font_characteristics, 
    managed_font
  );

  if (
    nullptr != managed_font 
    && 0 == managed_font_wss_dev
    && 0 == managed_font_us_dev
    && point_size == managed_font->PointSize()
    )
  {
    return managed_font;
  }


  for(;;)
  {
    if (set_font_characteristics->IsInstalledFont())
      break;

    const ON_Font* installed_font
      = m_installed_fonts.FromFontProperties(
        set_font_characteristics,
        true,
        true
      );
    if (nullptr == installed_font)
      break;

    set_font_characteristics = installed_font;
    if (bIsUnderlined || bIsStrikethrough || point_size > 0.0)
    {
      // Need a copy to set underlined/strikethrough/point_size
      fup = std::make_unique< ON_Font >(*installed_font);
      ON_Font* temporary_font = fup.get();
      if (nullptr != temporary_font)
      {
        temporary_font->SetUnderlined(bIsUnderlined);
        temporary_font->SetStrikethrough(bIsStrikethrough);
        temporary_font->SetPointSize(point_size);
        set_font_characteristics = temporary_font;
      }
    }

    // Look again now that we have settings known to be correct.
    managed_font = m_managed_fonts.FromFontProperties(
      set_font_characteristics,
      true,
      true,
      bIsUnderlined,
      bIsStrikethrough,
      point_size
      );

    managed_font_wss_dev = ON_Font::WeightStretchStyleDeviation(
      set_font_characteristics->FontWeight(), 
      set_font_characteristics->FontStretch(), 
      set_font_characteristics->FontStyle(), 
      managed_font
    );

    // RH - 60947
    managed_font_us_dev = ON_Font::UnderlinedStrikethroughDeviation(
      set_font_characteristics->IsUnderlined(),
      set_font_characteristics->IsStrikethrough(),
      managed_font
    );


    if (nullptr != managed_font 
      && 0 == managed_font_wss_dev
      && 0 == managed_font_us_dev
      )
      return managed_font;

    break;
  }

  if (false == bCreateIfNotFound)
    return nullptr;

  // The managed font constructor does not copy user data, m_font_index, m_font_id, m_gonna_change_font_cache
  ON_MemoryAllocationTracking disable_tracking(false);
  const ON_FontMetrics* font_metrics = nullptr;
  const ON_FontGlyphCache* font_glyph_cache = set_font_characteristics->m_font_glyph_cache.get();
  if (nullptr != font_glyph_cache)
    font_metrics = &font_glyph_cache->m_font_unit_metrics;
  managed_font = Internal_AddManagedFont(
    new ON_Font( ON_Font::FontType::ManagedFont, *set_font_characteristics),
    font_metrics
  );

  return managed_font;
}